

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_text_read::TextReader::read_number<unsigned_char>(TextReader *this,uchar *value)

{
  bool bVar1;
  int in_R8D;
  string_view str;
  undefined1 local_30 [8];
  string_view word;
  uchar *value_local;
  TextReader *this_local;
  
  word._M_str = (char *)value;
  _local_30 = read_word(this);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    str._M_str = word._M_str;
    str._M_len = word._M_len;
    this_local._7_1_ = to_num<unsigned_char>((ritobin *)local_30,str,(uchar *)0xa,in_R8D);
  }
  return this_local._7_1_;
}

Assistant:

bool read_number(T& value) noexcept {
            static_assert (std::is_arithmetic_v<T>);
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            return to_num(word, value);
        }